

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

optional<common::PSBTError> __thiscall
wallet::LegacyScriptPubKeyMan::FillPSBT
          (LegacyScriptPubKeyMan *this,PartiallySignedTransaction *psbtx,
          PrecomputedTransactionData *txdata,int sighash_type,bool sign,bool bip32derivs,
          int *n_signed,bool finalize)

{
  long lVar1;
  bool bVar2;
  PartiallySignedTransaction *psbt;
  PartiallySignedTransaction *pPVar3;
  reference provider;
  reference psbt_00;
  int *piVar4;
  size_type sVar5;
  ulong uVar6;
  int in_ECX;
  undefined8 in_RDI;
  byte in_R8B;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  int *in_stack_00000008;
  byte in_stack_00000010;
  uint i_1;
  bool signed_one;
  PSBTInput *input;
  CTxIn *txin;
  uint i;
  uint in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  SigningProvider *in_stack_ffffffffffffff10;
  HidingSigningProvider *in_stack_ffffffffffffff18;
  ulong in_stack_ffffffffffffff38;
  int iVar7;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint uVar8;
  int in_stack_ffffffffffffff6c;
  PrecomputedTransactionData *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  uint local_6c;
  _Optional_base<common::PSBTError,_true,_true> local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_stack_00000008 != (int *)0x0) {
    *in_stack_00000008 = 0;
  }
  local_6c = 0;
  iVar7 = in_ECX;
  do {
    psbt = (PartiallySignedTransaction *)(ulong)local_6c;
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)
               CONCAT17(in_stack_ffffffffffffff0f,
                        CONCAT16(in_stack_ffffffffffffff0e,
                                 CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))));
    pPVar3 = (PartiallySignedTransaction *)
             std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                        CONCAT17(in_stack_ffffffffffffff0f,
                                 CONCAT16(in_stack_ffffffffffffff0e,
                                          CONCAT24(in_stack_ffffffffffffff0c,
                                                   in_stack_ffffffffffffff08))));
    if (pPVar3 <= psbt) {
      uVar8 = 0;
      while( true ) {
        uVar6 = (ulong)uVar8;
        std::optional<CMutableTransaction>::operator->
                  ((optional<CMutableTransaction> *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,
                                     CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)))
                  );
        sVar5 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                          ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                           CONCAT17(in_stack_ffffffffffffff0f,
                                    CONCAT16(in_stack_ffffffffffffff0e,
                                             CONCAT24(in_stack_ffffffffffffff0c,
                                                      in_stack_ffffffffffffff08))));
        if (sVar5 <= uVar6) break;
        HidingSigningProvider::HidingSigningProvider
                  (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                   (bool)in_stack_ffffffffffffff0f,(bool)in_stack_ffffffffffffff0e);
        UpdatePSBTOutput((SigningProvider *)CONCAT44(iVar7,in_R9D),psbt,
                         (int)(in_stack_ffffffffffffff38 >> 0x20));
        HidingSigningProvider::~HidingSigningProvider
                  ((HidingSigningProvider *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,
                                     CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)))
                  );
        uVar8 = uVar8 + 1;
      }
      std::optional<common::PSBTError>::optional
                ((optional<common::PSBTError> *)
                 CONCAT17(in_stack_ffffffffffffff0f,
                          CONCAT16(in_stack_ffffffffffffff0e,
                                   CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))));
LAB_00a182a6:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (_Optional_base<common::PSBTError,_true,_true>)
             (_Optional_base<common::PSBTError,_true,_true>)
             local_10._M_payload.super__Optional_payload_base<common::PSBTError>;
    }
    std::optional<CMutableTransaction>::operator->
              ((optional<CMutableTransaction> *)
               CONCAT17(in_stack_ffffffffffffff0f,
                        CONCAT16(in_stack_ffffffffffffff0e,
                                 CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))));
    provider = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                         ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff18,
                          (size_type)in_stack_ffffffffffffff10);
    psbt_00 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at
                        ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_ffffffffffffff18,
                         (size_type)in_stack_ffffffffffffff10);
    bVar2 = PSBTInputSigned((PSBTInput *)
                            CONCAT17(in_stack_ffffffffffffff0f,
                                     CONCAT16(in_stack_ffffffffffffff0e,
                                              CONCAT24(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08))));
    if (!bVar2) {
      if ((((in_R8B & 1) != 0) &&
          (bVar2 = std::operator==(&psbt_00->sighash_type), ((bVar2 ^ 0xffU) & 1) != 0)) &&
         (piVar4 = std::optional<int>::operator*
                             ((optional<int> *)
                              CONCAT17(in_stack_ffffffffffffff0f,
                                       CONCAT16(in_stack_ffffffffffffff0e,
                                                CONCAT24(in_stack_ffffffffffffff0c,
                                                         in_stack_ffffffffffffff08)))),
         *piVar4 != in_ECX)) {
        std::optional<common::PSBTError>::optional<common::PSBTError,_true>
                  ((optional<common::PSBTError> *)in_stack_ffffffffffffff18,
                   (PSBTError *)in_stack_ffffffffffffff10);
        goto LAB_00a182a6;
      }
      bVar2 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT17(in_stack_ffffffffffffff0f,
                                  CONCAT16(in_stack_ffffffffffffff0e,
                                           CONCAT24(in_stack_ffffffffffffff0c,
                                                    in_stack_ffffffffffffff08))));
      if (bVar2) {
        in_stack_ffffffffffffff38 = (ulong)(provider->prevout).n;
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT17(in_stack_ffffffffffffff0f,
                               CONCAT16(in_stack_ffffffffffffff0e,
                                        CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ))));
        sVar5 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                          ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                           CONCAT17(in_stack_ffffffffffffff0f,
                                    CONCAT16(in_stack_ffffffffffffff0e,
                                             CONCAT24(in_stack_ffffffffffffff0c,
                                                      in_stack_ffffffffffffff08))));
        if (sVar5 <= in_stack_ffffffffffffff38) {
          std::optional<common::PSBTError>::optional<common::PSBTError,_true>
                    ((optional<common::PSBTError> *)in_stack_ffffffffffffff18,
                     (PSBTError *)in_stack_ffffffffffffff10);
          goto LAB_00a182a6;
        }
      }
      else {
        bVar2 = CTxOut::IsNull((CTxOut *)
                               CONCAT17(in_stack_ffffffffffffff0f,
                                        CONCAT16(in_stack_ffffffffffffff0e,
                                                 CONCAT24(in_stack_ffffffffffffff0c,
                                                          in_stack_ffffffffffffff08))));
        if (bVar2) goto LAB_00a181c3;
      }
      HidingSigningProvider::HidingSigningProvider
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f
                 ,(bool)in_stack_ffffffffffffff0e);
      in_stack_ffffffffffffff08 = (uint)(in_stack_00000010 & 1);
      SignPSBTInput((SigningProvider *)provider,(PartiallySignedTransaction *)psbt_00,
                    in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                    (SignatureData *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    SUB81((ulong)in_RDI >> 0x38,0));
      HidingSigningProvider::~HidingSigningProvider
                ((HidingSigningProvider *)
                 CONCAT17(in_stack_ffffffffffffff0f,
                          CONCAT16(in_stack_ffffffffffffff0e,
                                   CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))));
      bVar2 = PSBTInputSigned((PSBTInput *)
                              CONCAT17(in_stack_ffffffffffffff0f,
                                       CONCAT16(in_stack_ffffffffffffff0e,
                                                CONCAT24(in_stack_ffffffffffffff0c,
                                                         in_stack_ffffffffffffff08))));
      if ((in_stack_00000008 != (int *)0x0) && ((bVar2 || ((in_R8B & 1) == 0)))) {
        *in_stack_00000008 = *in_stack_00000008 + 1;
      }
    }
LAB_00a181c3:
    local_6c = local_6c + 1;
  } while( true );
}

Assistant:

std::optional<PSBTError> LegacyScriptPubKeyMan::FillPSBT(PartiallySignedTransaction& psbtx, const PrecomputedTransactionData& txdata, int sighash_type, bool sign, bool bip32derivs, int* n_signed, bool finalize) const
{
    if (n_signed) {
        *n_signed = 0;
    }
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        const CTxIn& txin = psbtx.tx->vin[i];
        PSBTInput& input = psbtx.inputs.at(i);

        if (PSBTInputSigned(input)) {
            continue;
        }

        // Get the Sighash type
        if (sign && input.sighash_type != std::nullopt && *input.sighash_type != sighash_type) {
            return PSBTError::SIGHASH_MISMATCH;
        }

        // Check non_witness_utxo has specified prevout
        if (input.non_witness_utxo) {
            if (txin.prevout.n >= input.non_witness_utxo->vout.size()) {
                return PSBTError::MISSING_INPUTS;
            }
        } else if (input.witness_utxo.IsNull()) {
            // There's no UTXO so we can just skip this now
            continue;
        }
        SignPSBTInput(HidingSigningProvider(this, !sign, !bip32derivs), psbtx, i, &txdata, sighash_type, nullptr, finalize);

        bool signed_one = PSBTInputSigned(input);
        if (n_signed && (signed_one || !sign)) {
            // If sign is false, we assume that we _could_ sign if we get here. This
            // will never have false negatives; it is hard to tell under what i
            // circumstances it could have false positives.
            (*n_signed)++;
        }
    }

    // Fill in the bip32 keypaths and redeemscripts for the outputs so that hardware wallets can identify change
    for (unsigned int i = 0; i < psbtx.tx->vout.size(); ++i) {
        UpdatePSBTOutput(HidingSigningProvider(this, true, !bip32derivs), psbtx, i);
    }

    return {};
}